

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O2

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  long lVar1;
  ulong uVar2;
  tm *ptVar3;
  long lVar4;
  ulong uVar5;
  char cStack_21;
  char DaysInMonth [12];
  long local_10;
  
  builtin_strncpy(DaysInMonth + 8,"\x1e\x1f\x1e\x1f",4);
  uVar5 = Year + 0x76c;
  if (99 < (ulong)Year) {
    uVar5 = Year;
  }
  if (Year < 0x45) {
    uVar5 = Year + 2000;
  }
  DaysInMonth[1] = 0x1c;
  if (((uVar5 & 3) == 0) && (DaysInMonth[1] = 0x1d, (long)uVar5 % 100 == 0)) {
    DaysInMonth[1] = (long)uVar5 % 400 == 0 | 0x1c;
  }
  DaysInMonth[0] = '\x1f';
  builtin_strncpy(DaysInMonth + 2,"\x1f\x1e\x1f\x1e\x1f\x1f",6);
  if (Day < 1) {
    return -1;
  }
  if (Month - 0xdU < 0xfffffffffffffff4) {
    return -1;
  }
  if (uVar5 - 0x7f7 < 0xffffffffffffffbb) {
    return -1;
  }
  if (0x3b < (ulong)Seconds) {
    return -1;
  }
  if (0x3b < (ulong)Minutes) {
    return -1;
  }
  if (0x17 < (ulong)Hours) {
    return -1;
  }
  if (Day <= DaysInMonth[Month + -1]) {
    lVar4 = Day + -1;
    for (lVar1 = 0; Month + -1 != lVar1; lVar1 = lVar1 + 1) {
      lVar4 = lVar4 + DaysInMonth[lVar1];
    }
    for (uVar2 = 0x7b2; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      lVar4 = lVar4 + 0x16d + (ulong)((uVar2 & 3) == 0);
    }
    local_10 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Timezone + lVar4 * 0x15180;
    if (DSTmode != DSTon) {
      if (DSTmode != DSTmaybe) {
        return local_10;
      }
      ptVar3 = localtime(&local_10);
      if (ptVar3->tm_isdst == 0) {
        return local_10;
      }
    }
    return local_10 + -0xe10;
  }
  return -1;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	signed char DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}